

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void ordinary(parse *p,int ch)

{
  int iVar1;
  cat_t *pcVar2;
  char cVar3;
  ushort **ppuVar4;
  cat_t *cap;
  int ch_local;
  parse *p_local;
  
  pcVar2 = p->g->categories;
  if ((((p->g->cflags & 2U) == 0) || (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[ch] & 0x400) == 0)) ||
     (cVar3 = othercase(ch), cVar3 == ch)) {
    doemit(p,0x8000000,(long)ch);
    if (pcVar2[ch] == '\0') {
      iVar1 = p->g->ncategories;
      p->g->ncategories = iVar1 + 1;
      pcVar2[ch] = (cat_t)iVar1;
    }
  }
  else {
    bothcases(p,ch);
  }
  return;
}

Assistant:

static void
ordinary(p, ch)
struct parse *p;
int ch;
{
	cat_t *cap = p->g->categories;

	if ((p->g->cflags&REG_ICASE) && isalpha(ch) && othercase(ch) != ch)
		bothcases(p, ch);
	else {
		EMIT(OCHAR, (sopno)ch);
		if (cap[ch] == 0)
			cap[ch] = (cat_t)(p->g->ncategories++);
	}
}